

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_cte_node.cpp
# Opt level: O3

unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true> __thiscall
duckdb::Binder::BindCTE(Binder *this,CTENode *statement)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> _Var2;
  pointer pcVar3;
  _Hash_node_base *p_Var4;
  pointer pCVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  optional_ptr<duckdb::Binder,_true> parent;
  string *alias;
  char cVar9;
  element_type *peVar10;
  pointer pBVar11;
  idx_t iVar12;
  Binder *pBVar13;
  pointer pBVar14;
  reference pvVar15;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  long *plVar17;
  pointer pQVar18;
  type pBVar19;
  ulong uVar20;
  _Hash_node_base *in_RDX;
  CorrelatedColumnInfo *c;
  pointer pbVar21;
  pointer info;
  char cVar22;
  _Hash_node_base *p_Var23;
  __node_base _Var24;
  pointer *__ptr;
  _Hash_node_base *p_Var25;
  unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> *modifier;
  ulong uVar26;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c8;
  _Hash_node_base *local_b0;
  size_t local_a8;
  _Hash_node_base local_a0;
  __buckets_ptr pp_Stack_98;
  __node_base *local_90;
  uint local_88;
  undefined4 uStack_84;
  __node_base local_80 [2];
  _Hash_node_base **local_70;
  __node_base_ptr local_68;
  _Hash_node_base *local_60 [2];
  __node_base local_50;
  optional_ptr<duckdb::Binder,_true> local_48;
  string *local_40;
  pointer local_38;
  
  peVar10 = (element_type *)operator_new(0xb0);
  *(undefined1 *)
   &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar10->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->_M_pi = 5;
  peVar10->context = (ClientContext *)0x0;
  (peVar10->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(size_type *)((long)&(peVar10->CTE_bindings)._M_h + 8) = 0;
  ((__node_base *)((long)&(peVar10->CTE_bindings)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
  *(size_type *)((long)&(peVar10->CTE_bindings)._M_h + 0x18) = 0;
  *(undefined8 *)((long)&(peVar10->CTE_bindings)._M_h + 0x20) = 0;
  *(size_t *)((long)&(peVar10->CTE_bindings)._M_h + 0x28) = 0;
  *(__node_base_ptr *)((long)&(peVar10->CTE_bindings)._M_h + 0x30) = (__node_base_ptr)0x0;
  (peVar10->bound_ctes)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined ***)&(peVar10->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ =
       &PTR__BoundCTENode_019a05a8;
  *(size_type **)((long)&(peVar10->bound_ctes)._M_h + 8) =
       (size_type *)((long)&(peVar10->bound_ctes)._M_h + 0x18);
  ((__node_base *)((long)&(peVar10->bound_ctes)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
  *(undefined1 *)((long)&(peVar10->bound_ctes)._M_h + 0x18) = 0;
  *(size_t *)((long)&(peVar10->bound_ctes)._M_h + 0x28) = 0;
  *(__node_base_ptr *)((long)&(peVar10->bound_ctes)._M_h + 0x30) = (__node_base_ptr)0x0;
  *(size_type *)((long)&(peVar10->bind_context).cte_references + 8) = 0;
  ((__node_base *)((long)&(peVar10->bind_context).cte_references + 0x10))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)((long)&(peVar10->bind_context).cte_references + 0x18) = 0;
  *(undefined8 *)((long)&(peVar10->bind_context).cte_references + 0x20) = 0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10;
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  local_40 = (string *)(in_RDX + 0xf);
  ::std::__cxx11::string::_M_assign((string *)&pBVar11->ctename);
  iVar12 = GenerateTableIndex((Binder *)statement);
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  pBVar11->setop_index = iVar12;
  CreateBinder((Binder *)local_e8,
               (ClientContext *)
               (statement->super_QueryNode).modifiers.
               super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (optional_ptr<duckdb::Binder,_true>)statement,REGULAR_BINDER);
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  uVar8 = local_e8._8_8_;
  uVar7 = local_e8._0_8_;
  local_e8._0_8_ = (element_type *)0x0;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (pBVar11->query_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar11->query_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar7;
  (pBVar11->query_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar11->query_binder);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             (in_RDX + 0x13));
  BindNode((Binder *)local_e8,(QueryNode *)pBVar13);
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  uVar7 = local_e8._0_8_;
  local_e8._0_8_ = (element_type *)0x0;
  _Var2._M_head_impl =
       (pBVar11->query).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar11->query).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)uVar7;
  if ((_Var2._M_head_impl != (BoundQueryNode *)0x0) &&
     ((**(code **)((long)(_Var2._M_head_impl)->_vptr_BoundQueryNode + 8))(),
     (element_type *)local_e8._0_8_ != (element_type *)0x0)) {
    (**(code **)(*(long *)local_e8._0_8_ + 8))();
  }
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  pBVar14 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
            operator->(&pBVar11->query);
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &(pBVar11->super_BoundQueryNode).types,
             &(pBVar14->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  pBVar14 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
            operator->(&pBVar11->query);
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pBVar11->super_BoundQueryNode).names,
              &(pBVar14->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  if (in_RDX[0x16]._M_nxt != in_RDX[0x15]._M_nxt) {
    uVar26 = 0;
    do {
      pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
                operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                            *)this);
      if ((ulong)((long)(pBVar11->super_BoundQueryNode).names.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar11->super_BoundQueryNode).names.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar26) break;
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)(in_RDX + 0x15),uVar26);
      pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
                operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                            *)this);
      pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](&(pBVar11->super_BoundQueryNode).names,uVar26);
      ::std::__cxx11::string::_M_assign((string *)pvVar15);
      uVar26 = uVar26 + 1;
    } while (uVar26 < (ulong)((long)in_RDX[0x16]._M_nxt - (long)in_RDX[0x15]._M_nxt >> 5));
  }
  local_c8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_nxt = in_RDX;
  local_48.ptr = (Binder *)statement;
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  pbVar21 = (pBVar11->super_BoundQueryNode).names.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (pBVar11->super_BoundQueryNode).names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar21 != local_38) {
    uVar26 = 1;
    do {
      local_e8._0_8_ = local_e8 + 0x10;
      pcVar3 = (pbVar21->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar3,pcVar3 + pbVar21->_M_string_length);
      while (_Var16 = ::std::
                      __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                (local_c8.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 local_c8.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,local_e8),
            _Var16._M_current !=
            local_c8.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar3 = (pbVar21->_M_dataplus)._M_p;
        local_70 = local_60;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + pbVar21->_M_string_length);
        ::std::__cxx11::string::append((char *)&local_70);
        cVar22 = '\x01';
        if (9 < uVar26) {
          uVar20 = uVar26;
          cVar9 = '\x04';
          do {
            cVar22 = cVar9;
            if (uVar20 < 100) {
              cVar22 = cVar22 + -2;
              goto LAB_00c8c3bb;
            }
            if (uVar20 < 1000) {
              cVar22 = cVar22 + -1;
              goto LAB_00c8c3bb;
            }
            if (uVar20 < 10000) goto LAB_00c8c3bb;
            bVar6 = 99999 < uVar20;
            uVar20 = uVar20 / 10000;
            cVar9 = cVar22 + '\x04';
          } while (bVar6);
          cVar22 = cVar22 + '\x01';
        }
LAB_00c8c3bb:
        local_90 = local_80;
        ::std::__cxx11::string::_M_construct((ulong)&local_90,cVar22);
        ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar26);
        p_Var23 = (_Hash_node_base *)0xf;
        if (local_70 != local_60) {
          p_Var23 = local_60[0];
        }
        p_Var4 = (_Hash_node_base *)((long)&local_68->_M_nxt + CONCAT44(uStack_84,local_88));
        if (p_Var23 < p_Var4) {
          _Var24._M_nxt = (_Hash_node_base *)0xf;
          if (local_90 != local_80) {
            _Var24._M_nxt = local_80[0]._M_nxt;
          }
          if (_Var24._M_nxt < p_Var4) goto LAB_00c8c428;
          plVar17 = (long *)::std::__cxx11::string::replace
                                      ((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
        }
        else {
LAB_00c8c428:
          plVar17 = (long *)::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
        }
        local_b0 = &local_a0;
        p_Var23 = (_Hash_node_base *)(plVar17 + 2);
        if ((_Hash_node_base *)*plVar17 == p_Var23) {
          local_a0._M_nxt = p_Var23->_M_nxt;
          pp_Stack_98 = (__buckets_ptr)plVar17[3];
        }
        else {
          local_a0._M_nxt = p_Var23->_M_nxt;
          local_b0 = (_Hash_node_base *)*plVar17;
        }
        local_a8 = plVar17[1];
        *plVar17 = (long)p_Var23;
        plVar17[1] = 0;
        *(undefined1 *)&p_Var23->_M_nxt = 0;
        ::std::__cxx11::string::operator=((string *)local_e8,(string *)&local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        uVar26 = uVar26 + 1;
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c8,(value_type *)local_e8);
      if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_);
      }
      pbVar21 = pbVar21 + 1;
    } while (pbVar21 != local_38);
  }
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  alias = local_40;
  parent.ptr = local_48.ptr;
  iVar12 = pBVar11->setop_index;
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  BindContext::AddGenericBinding
            (&(parent.ptr)->bind_context,iVar12,alias,&local_c8,
             &(pBVar11->super_BoundQueryNode).types);
  CreateBinder((Binder *)local_e8,(parent.ptr)->context,parent,REGULAR_BINDER);
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  uVar8 = local_e8._8_8_;
  uVar7 = local_e8._0_8_;
  local_e8._0_8_ = (element_type *)0x0;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (pBVar11->child_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar11->child_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar7;
  (pBVar11->child_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar11->child_binder);
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  iVar12 = pBVar11->setop_index;
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  BindContext::AddCTEBinding
            (&pBVar13->bind_context,iVar12,alias,&local_c8,&(pBVar11->super_BoundQueryNode).types,
             false);
  if (local_50._M_nxt[0x14]._M_nxt != (_Hash_node_base *)0x0) {
    p_Var23 = local_50._M_nxt[2]._M_nxt;
    p_Var4 = local_50._M_nxt[3]._M_nxt;
    if (p_Var23 != p_Var4) {
      do {
        pQVar18 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                  operator->((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                              *)(local_50._M_nxt + 0x14));
        ::std::
        vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                    *)&pQVar18->modifiers,
                   (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                    *)p_Var23);
        p_Var23 = p_Var23 + 1;
      } while (p_Var23 != p_Var4);
      p_Var23 = local_50._M_nxt[2]._M_nxt;
      p_Var4 = local_50._M_nxt[3]._M_nxt;
      p_Var25 = p_Var23;
      if (p_Var4 != p_Var23) {
        do {
          if (p_Var25->_M_nxt != (_Hash_node_base *)0x0) {
            (*(code *)p_Var25->_M_nxt->_M_nxt[1]._M_nxt)();
          }
          p_Var25->_M_nxt = (_Hash_node_base *)0x0;
          p_Var25 = p_Var25 + 1;
        } while (p_Var25 != p_Var4);
        local_50._M_nxt[3]._M_nxt = p_Var23;
      }
    }
    pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
              operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                          *)this);
    pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar11->child_binder);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               (local_50._M_nxt + 0x14));
    BindNode((Binder *)local_e8,(QueryNode *)pBVar13);
    pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
              operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                          *)this);
    uVar7 = local_e8._0_8_;
    local_e8._0_8_ = (element_type *)0x0;
    _Var2._M_head_impl =
         (pBVar11->child).
         super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
         .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
    (pBVar11->child).
    super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
    super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)uVar7;
    if ((_Var2._M_head_impl != (BoundQueryNode *)0x0) &&
       ((**(code **)((long)(_Var2._M_head_impl)->_vptr_BoundQueryNode + 8))(),
       (element_type *)local_e8._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
    pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
              operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                          *)this);
    pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar11->query_binder);
    pCVar5 = (pBVar13->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (info = (pBVar13->correlated_columns).
                super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                .
                super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; info != pCVar5; info = info + 1) {
      pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
                operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                            *)this);
      pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar11->child_binder);
      AddCorrelatedColumn(pBVar13,info);
    }
    pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
              operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                          *)this);
    pBVar14 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar11->child);
    pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
              operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                          *)this);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &(pBVar11->super_BoundQueryNode).types,
               &(pBVar14->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
              operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                          *)this);
    pBVar14 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar11->child);
    pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
              operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                          *)this);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pBVar11->super_BoundQueryNode).names,
                &(pBVar14->names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
              operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                          *)this);
    pBVar19 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar11->child_binder);
    MoveCorrelatedExpressions(parent.ptr,pBVar19);
  }
  pBVar11 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
            operator->((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)this);
  pBVar19 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar11->query_binder);
  MoveCorrelatedExpressions(parent.ptr,pBVar19);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  return (unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>_>)
         (unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>_>)this;
}

Assistant:

unique_ptr<BoundCTENode> Binder::BindCTE(CTENode &statement) {
	auto result = make_uniq<BoundCTENode>();

	// first recursively visit the materialized CTE operations
	// the left side is visited first and is added to the BindContext of the right side
	D_ASSERT(statement.query);

	result->ctename = statement.ctename;
	result->setop_index = GenerateTableIndex();

	result->query_binder = Binder::CreateBinder(context, this);
	result->query = result->query_binder->BindNode(*statement.query);

	// the result types of the CTE are the types of the LHS
	result->types = result->query->types;
	// names are picked from the LHS, unless aliases are explicitly specified
	result->names = result->query->names;
	for (idx_t i = 0; i < statement.aliases.size() && i < result->names.size(); i++) {
		result->names[i] = statement.aliases[i];
	}

	// Rename columns if duplicate names are detected
	idx_t index = 1;
	vector<string> names;
	for (auto &n : result->names) {
		string name = n;
		while (find(names.begin(), names.end(), name) != names.end()) {
			name = n + "_" + std::to_string(index++);
		}
		names.push_back(name);
	}

	// This allows the right side to reference the CTE
	bind_context.AddGenericBinding(result->setop_index, statement.ctename, names, result->types);

	result->child_binder = Binder::CreateBinder(context, this);

	// Add bindings of left side to temporary CTE bindings context
	result->child_binder->bind_context.AddCTEBinding(result->setop_index, statement.ctename, names, result->types);

	if (statement.child) {
		// Move all modifiers to the child node.
		for (auto &modifier : statement.modifiers) {
			statement.child->modifiers.push_back(std::move(modifier));
		}

		statement.modifiers.clear();

		result->child = result->child_binder->BindNode(*statement.child);
		for (auto &c : result->query_binder->correlated_columns) {
			result->child_binder->AddCorrelatedColumn(c);
		}

		// the result types of the CTE are the types of the LHS
		result->types = result->child->types;
		result->names = result->child->names;

		MoveCorrelatedExpressions(*result->child_binder);
	}

	MoveCorrelatedExpressions(*result->query_binder);

	return result;
}